

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

FIOBJ fiobj_hash_get2(FIOBJ hash,uint64_t key_hash)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  FIOBJ FVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x138,"FIOBJ fiobj_hash_get2(const FIOBJ, uint64_t)");
  }
  uVar8 = hash & 0xfffffffffffffff8;
  if (*(long *)(uVar8 + 0x28) != 0) {
    uVar12 = -(ulong)(key_hash == 0) | key_hash;
    if ((*(char *)(uVar8 + 0x30) != '\0') && (*(long *)(uVar8 + 0x18) != *(long *)(uVar8 + 8))) {
      fio_hash___rehash((fio_hash___s *)(uVar8 + 8));
    }
    bVar1 = *(byte *)(uVar8 + 0x31);
    bVar9 = false;
    uVar7 = 0;
    if (bVar1 != 0) {
      uVar7 = uVar12;
    }
    uVar4 = ~(-1L << (bVar1 & 0x3f));
    uVar7 = uVar7 ^ (uVar12 >> (bVar1 & 0x3f) | uVar12 << 0x40 - (bVar1 & 0x3f));
    lVar2 = *(long *)(uVar8 + 0x28);
    lVar10 = (uVar7 & uVar4) * 0x10;
    uVar6 = *(ulong *)(lVar2 + lVar10);
    if (uVar6 == uVar12 || uVar6 == 0) {
      uVar6 = lVar2 + lVar10;
    }
    else {
      uVar6 = *(ulong *)(uVar8 + 0x10) >> 2;
      uVar11 = 0x420;
      if (*(ulong *)(uVar8 + 0x10) < 0x181) {
        uVar11 = uVar6 * 0xb;
      }
      if (uVar11 == 0) {
        bVar9 = true;
      }
      else {
        uVar8 = 0xb;
        do {
          lVar10 = (uVar7 + uVar8 & uVar4) * 0x10;
          uVar6 = lVar2 + lVar10;
          uVar3 = *(ulong *)(lVar2 + lVar10);
          bVar9 = uVar3 != uVar12 && uVar3 != 0;
          if (uVar3 == uVar12 || uVar3 == 0) break;
          bVar13 = uVar8 < uVar11;
          uVar8 = uVar8 + 0xb;
        } while (bVar13);
      }
    }
    if (!bVar9) goto LAB_00142a36;
  }
  uVar6 = 0;
LAB_00142a36:
  if ((uVar6 == 0) || (*(long *)(uVar6 + 8) == 0)) {
    FVar5 = 0;
  }
  else {
    FVar5 = *(FIOBJ *)(*(long *)(uVar6 + 8) + 0x10);
  }
  return FVar5;
}

Assistant:

FIOBJ fiobj_hash_get2(const FIOBJ hash, uint64_t key_hash) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, key_hash, -1);
  ;
}